

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  size_type sVar1;
  StringPiece *in_RSI;
  double dVar2;
  allocator<char> local_61;
  StringPiece local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_19;
  StringPiece *local_18;
  StringPiece *pattern_local;
  
  local_18 = in_RSI;
  pattern_local = (StringPiece *)this;
  sVar1 = StringPiece::size(in_RSI);
  if (sVar1 < 100) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<re2::StringPiece,void>((string *)this,local_18,&local_19);
    dVar2 = (double)std::allocator<char>::~allocator(&local_19);
  }
  else {
    local_60 = StringPiece::substr(local_18,0,100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<re2::StringPiece,void>((string *)&local_50,&local_60,&local_61);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   &local_50,"...");
    std::__cxx11::string::~string((string *)&local_50);
    dVar2 = (double)std::allocator<char>::~allocator(&local_61);
  }
  return dVar2;
}

Assistant:

static std::string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return std::string(pattern);
  return std::string(pattern.substr(0, 100)) + "...";
}